

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void fmt::v8::detail::
     value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>
     ::
     format_custom_arg<jessilib::io::ansi::text_wrapper,fmt::v8::formatter<jessilib::io::ansi::text_wrapper,char8_t,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>
               *ctx)

{
  size_t *psVar1;
  char8_t *pcVar2;
  iterator pcVar3;
  long lVar4;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_38 = 0;
  uStack_20 = 0;
  local_58 = 0xffffffff00000000;
  uStack_50 = 0x100000020000000;
  local_48 = 0;
  uStack_40 = 0;
  uStack_30 = 0;
  local_28 = 0;
  pcVar3 = formatter<fmt::v8::basic_string_view<char8_t>,char8_t,void>::
           parse<fmt::v8::basic_format_parse_context<char8_t,fmt::v8::detail::error_handler>>
                     ((formatter<fmt::v8::basic_string_view<char8_t>,char8_t,void> *)&local_58,
                      parse_ctx);
  pcVar2 = (parse_ctx->format_str_).data_;
  lVar4 = (long)pcVar3 - (long)pcVar2;
  if (-1 < lVar4) {
    (parse_ctx->format_str_).data_ = pcVar2 + lVar4;
    psVar1 = &(parse_ctx->format_str_).size_;
    *psVar1 = *psVar1 - lVar4;
    formatter<jessilib::io::ansi::text_wrapper,char8_t,void>::
    format<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>
              ((formatter<jessilib::io::ansi::text_wrapper,char8_t,void> *)&local_58,
               (text_wrapper *)arg,ctx);
    return;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
             ,0x195,"negative value");
}

Assistant:

static void format_custom_arg(void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    auto f = Formatter();
    parse_ctx.advance_to(f.parse(parse_ctx));
    using qualified_type =
        conditional_t<has_const_formatter<T, Context>(), const T, T>;
    ctx.advance_to(f.format(*static_cast<qualified_type*>(arg), ctx));
  }